

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.cpp
# Opt level: O2

bool __thiscall cppcms::cache_interface::fetch_page(cache_interface *this,string *key)

{
  base_cache *pbVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  response *prVar5;
  ostream *poVar6;
  char *__lhs;
  string tmp;
  string r_key;
  allocator local_81;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (((this->cache_module_).p_ == (base_cache *)0x0) || (this->context_ == (context *)0x0)) {
    cVar3 = '\0';
  }
  else {
    prVar5 = http::context::response(this->context_);
    bVar2 = http::response::need_gzip(prVar5);
    *(uint *)&this->field_0x78 = *(uint *)&this->field_0x78 & 0xfffffffe | (uint)bVar2;
    __lhs = "_U:";
    if (bVar2) {
      __lhs = "_Z:";
    }
    std::operator+(&local_40,__lhs,key);
    local_80 = local_70;
    local_78 = 0;
    local_70[0] = 0;
    pbVar1 = (this->cache_module_).p_;
    iVar4 = (**pbVar1->_vptr_base_cache)(pbVar1,&local_40,&local_80,0,0,0);
    cVar3 = (char)iVar4;
    if (cVar3 == '\0') {
      prVar5 = http::context::response(this->context_);
      http::response::copy_to_cache(prVar5);
    }
    else {
      if (bVar2) {
        prVar5 = http::context::response(this->context_);
        std::__cxx11::string::string((string *)&local_60,"gzip",&local_81);
        http::response::content_encoding(prVar5,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
      prVar5 = http::context::response(this->context_);
      poVar6 = http::response::out(prVar5);
      std::ostream::write((char *)poVar6,(long)local_80);
    }
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return (bool)cVar3;
}

Assistant:

bool cache_interface::nocache()
{
	return cache_module_.get()==0;
}